

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O1

void __thiscall
presolve::HPresolve::changeImplRowDualUpper
          (HPresolve *this,HighsInt row,double newUpper,HighsInt originCol)

{
  int oldImplVarUpperSource;
  int node;
  HighsInt *pHVar1;
  bool bVar2;
  bool bVar3;
  long lVar4;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *this_00;
  vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *pvVar5;
  double dVar6;
  pair<std::_Rb_tree_iterator<int>,_std::_Rb_tree_iterator<int>_> pVar7;
  iterator __begin1;
  HighsInt local_94;
  vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *local_90;
  double local_88;
  HighsInt local_7c;
  iterator local_78;
  
  local_88 = (this->implRowDualUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[row];
  oldImplVarUpperSource =
       (this->rowDualUpperSource).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start[row];
  dVar6 = -(this->options->super_HighsOptionsStruct).dual_feasibility_tolerance;
  local_94 = row;
  local_90 = (vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)newUpper;
  if ((dVar6 <= local_88) && (newUpper < dVar6)) {
    markChangedRow(this,row);
  }
  lVar4 = (long)local_94;
  bVar2 = isDualImpliedFree(this,local_94);
  if (bVar2) {
    bVar2 = false;
  }
  else {
    dVar6 = (this->rowDualUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar4] +
            (this->options->super_HighsOptionsStruct).dual_feasibility_tolerance;
    if (local_88 <= dVar6) {
      bVar2 = false;
    }
    else {
      bVar2 = (double)local_90 <= dVar6;
    }
  }
  if (oldImplVarUpperSource != originCol) {
    if ((oldImplVarUpperSource != -1) &&
       (oldImplVarUpperSource !=
        (this->rowDualLowerSource).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[lVar4])) {
      this_00 = &(this->implRowDualSourceByCol).
                 super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[oldImplVarUpperSource]._M_t;
      pVar7 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
              equal_range(this_00,&local_94);
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
      _M_erase_aux(this_00,(_Base_ptr)pVar7.first._M_node,(_Base_ptr)pVar7.second._M_node);
    }
    if (originCol != -1) {
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_emplace_unique<int&>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 ((this->implRowDualSourceByCol).
                  super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + originCol),&local_94);
    }
    (this->rowDualUpperSource).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start[local_94] = originCol;
  }
  lVar4 = (long)local_94;
  (this->implRowDualUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start[lVar4] = (double)local_90;
  if (!bVar2) {
    pvVar5 = local_90;
    if (local_88 <= (double)local_90) {
      pvVar5 = (vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)local_88;
    }
    if ((this->rowDualUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[lVar4] <= (double)pvVar5) {
      return;
    }
  }
  node = (this->rowroot).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_start[lVar4];
  if (node == -1) {
    local_78.stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_78.stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_78.nodeLeft = (HighsInt *)0x0;
    local_78.nodeRight = (HighsInt *)0x0;
    local_78.pos_.index_ = (HighsInt *)0x0;
    local_78.pos_.value_ = (double *)0x0;
    local_78.stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_78.currentNode = -1;
  }
  else {
    HighsMatrixSlice<HighsTripletTreeSlicePreOrder>::iterator::iterator
              (&local_78,
               (this->Acol).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
               (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start,
               (this->ARleft).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
               (this->ARright).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,node);
  }
  local_90 = (vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
             &this->substitutionOpportunities;
  while (local_78.currentNode != -1) {
    HighsLinearSumBounds::updatedImplVarUpper
              (&this->impliedDualRowBounds,*local_78.pos_.index_,local_94,*local_78.pos_.value_,
               local_88,oldImplVarUpperSource);
    markChangedCol(this,*local_78.pos_.index_);
    pHVar1 = local_78.pos_.index_;
    if ((bVar2) && (bVar3 = isImpliedFree(this,*local_78.pos_.index_), bVar3)) {
      local_7c = *pHVar1;
      std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int&,int>
                (local_90,&local_94,&local_7c);
    }
    HighsMatrixSlice<HighsTripletTreeSlicePreOrder>::iterator::operator++(&local_78);
  }
  if (local_78.stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_78.stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void HPresolve::changeImplRowDualUpper(HighsInt row, double newUpper,
                                       HighsInt originCol) {
  double oldImplUpper = implRowDualUpper[row];
  HighsInt oldUpperSource = rowDualUpperSource[row];

  if (oldImplUpper >= -options->dual_feasibility_tolerance &&
      newUpper < -options->dual_feasibility_tolerance)
    markChangedRow(row);

  bool newDualImplied =
      !isDualImpliedFree(row) &&
      oldImplUpper > rowDualUpper[row] + options->dual_feasibility_tolerance &&
      newUpper <= rowDualUpper[row] + options->dual_feasibility_tolerance;

  // remember the source of this upper bound, so that we can correctly identify
  // weak domination
  if (oldUpperSource != originCol) {
    if (oldUpperSource != -1 && oldUpperSource != rowDualLowerSource[row])
      implRowDualSourceByCol[oldUpperSource].erase(row);
    if (originCol != -1) implRowDualSourceByCol[originCol].emplace(row);

    rowDualUpperSource[row] = originCol;
  }

  // update implied bound
  implRowDualUpper[row] = newUpper;

  // nothing needs to be updated
  if (!newDualImplied && std::min(oldImplUpper, newUpper) >= rowDualUpper[row])
    return;

  for (const HighsSliceNonzero& nonzero : getRowVector(row)) {
    impliedDualRowBounds.updatedImplVarUpper(
        nonzero.index(), row, nonzero.value(), oldImplUpper, oldUpperSource);
    markChangedCol(nonzero.index());

    if (newDualImplied && isImpliedFree(nonzero.index()))
      substitutionOpportunities.emplace_back(row, nonzero.index());
  }
}